

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP4Reader::OpenFiles
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds,Seconds *timeoutSeconds)

{
  string *name;
  Comm *this_00;
  BP4Deserializer *pBVar1;
  _func_int **pp_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator local_183;
  allocator local_182;
  allocator local_181;
  size_t flag;
  string metadataFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string metadataIndexFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Seconds *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string lasterrmsg;
  string local_50;
  
  lasterrmsg._M_dataplus._M_p = (pointer)&lasterrmsg.field_2;
  lasterrmsg._M_string_length = 0;
  flag = 1;
  lasterrmsg.field_2._M_local_buf[0] = '\0';
  pBVar1 = &this->m_BP4Deserializer;
  pp_Var2 = (this->m_BP4Deserializer)._vptr_BP4Deserializer;
  if (*(int *)(pp_Var2[-4] + 0x10 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
    name = &(this->super_Engine).m_Name;
    local_b8 = timeoutSeconds;
    adios2::format::BP4Base::GetBPMetadataIndexFileName
              (&metadataIndexFile,
               (BP4Base *)((long)&pBVar1->_vptr_BP4Deserializer + (long)pp_Var2[-3]),name);
    std::__cxx11::string::string((string *)&metadataFile,(string *)&metadataIndexFile);
    __l._M_len = 1;
    __l._M_array = &metadataFile;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_158,__l,(allocator_type *)&local_118);
    flag = OpenWithTimeout(this,&this->m_MDIndexFileManager,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_158,timeoutInstant,pollSeconds,&lasterrmsg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_158);
    std::__cxx11::string::~string((string *)&metadataFile);
    if (flag == 0) {
      adios2::format::BP4Base::GetBPMetadataFileName
                (&metadataFile,
                 (BP4Base *)
                 ((long)&pBVar1->_vptr_BP4Deserializer + (long)pBVar1->_vptr_BP4Deserializer[-3]),
                 name);
      if ((local_b8->__r == 0.0) && (!NAN(local_b8->__r))) {
        (timeoutInstant->__d).__r = (timeoutInstant->__d).__r + 5000000000.0;
      }
      std::__cxx11::string::string((string *)&local_158,(string *)&metadataFile);
      __l_00._M_len = 1;
      __l_00._M_array = &local_158;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_118,__l_00,(allocator_type *)&local_f8);
      flag = OpenWithTimeout(this,&this->m_MDFileManager,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_118,timeoutInstant,pollSeconds,&lasterrmsg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_118);
      std::__cxx11::string::~string((string *)&local_158);
      if (flag != 0) {
        transportman::TransportMan::CloseFiles(&this->m_MDIndexFileManager,-1);
      }
      std::__cxx11::string::~string((string *)&metadataFile);
    }
    std::__cxx11::string::~string((string *)&metadataIndexFile);
    timeoutSeconds = local_b8;
  }
  std::__cxx11::string::string
            ((string *)&metadataIndexFile,"wait for rank 0 to open...",(allocator *)&metadataFile);
  this_00 = &(this->super_Engine).m_Comm;
  helper::Comm::Barrier(this_00,&metadataIndexFile);
  std::__cxx11::string::~string((string *)&metadataIndexFile);
  flag = helper::Comm::BroadcastValue<unsigned_long>(this_00,&flag,0);
  if (flag == 1) {
    if (*(int *)(pBVar1->_vptr_BP4Deserializer[-4] + 0x10 +
                (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
      std::__cxx11::string::string((string *)&metadataIndexFile,"Engine",&local_182);
      std::__cxx11::string::string((string *)&metadataFile,"BP4Reader",&local_183);
      std::__cxx11::string::string((string *)&local_158,"OpenFiles",&local_181);
      std::operator+(&local_b0,"File ",&(this->super_Engine).m_Name);
      std::operator+(&local_90,&local_b0," could not be found within the ");
      std::__cxx11::to_string(&local_50,timeoutSeconds->__r);
      std::operator+(&local_d8,&local_90,&local_50);
      std::operator+(&local_f8,&local_d8,"s timeout: ");
      std::operator+(&local_118,&local_f8,&lasterrmsg);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&metadataIndexFile,&metadataFile,&local_158,&local_118,-1);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      this_01 = &local_b0;
    }
    else {
      std::__cxx11::string::string((string *)&metadataIndexFile,"Engine",(allocator *)&local_50);
      std::__cxx11::string::string((string *)&metadataFile,"BP4Reader",&local_182);
      std::__cxx11::string::string((string *)&local_158,"OpenFiles",&local_183);
      std::operator+(&local_90,"File ",&(this->super_Engine).m_Name);
      std::operator+(&local_d8,&local_90," could not be found within the ");
      std::__cxx11::to_string(&local_b0,timeoutSeconds->__r);
      std::operator+(&local_f8,&local_d8,&local_b0);
      std::operator+(&local_118,&local_f8,"s timeout");
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&metadataIndexFile,&metadataFile,&local_158,&local_118,-1);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d8);
      this_01 = &local_90;
    }
  }
  else {
    if (flag != 2) goto LAB_0049a064;
    if ((*(int *)(pBVar1->_vptr_BP4Deserializer[-4] + 0x10 +
                 (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) &&
       (lasterrmsg._M_string_length != 0)) {
      std::__cxx11::string::string((string *)&metadataIndexFile,"Engine",(allocator *)&local_90);
      std::__cxx11::string::string((string *)&metadataFile,"BP4Reader",(allocator *)&local_b0);
      std::__cxx11::string::string((string *)&local_158,"OpenFiles",(allocator *)&local_50);
      std::operator+(&local_d8,"File ",&(this->super_Engine).m_Name);
      std::operator+(&local_f8,&local_d8," cannot be opened: ");
      std::operator+(&local_118,&local_f8,&lasterrmsg);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&metadataIndexFile,&metadataFile,&local_158,&local_118,-1);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_f8);
      this_01 = &local_d8;
    }
    else {
      std::__cxx11::string::string((string *)&metadataIndexFile,"Engine",(allocator *)&local_d8);
      std::__cxx11::string::string((string *)&metadataFile,"BP4Reader",(allocator *)&local_90);
      std::__cxx11::string::string((string *)&local_158,"OpenFiles",(allocator *)&local_b0);
      std::operator+(&local_f8,"File ",&(this->super_Engine).m_Name);
      std::operator+(&local_118,&local_f8," cannot be opened");
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&metadataIndexFile,&metadataFile,&local_158,&local_118,-1);
      std::__cxx11::string::~string((string *)&local_118);
      this_01 = &local_f8;
    }
  }
  std::__cxx11::string::~string((string *)this_01);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&metadataFile);
  std::__cxx11::string::~string((string *)&metadataIndexFile);
LAB_0049a064:
  std::__cxx11::string::~string((string *)&lasterrmsg);
  return;
}

Assistant:

void BP4Reader::OpenFiles(TimePoint &timeoutInstant, const Seconds &pollSeconds,
                          const Seconds &timeoutSeconds)
{
    /* Poll */
    size_t flag = 1; // 0 = OK, opened file, 1 = timeout, 2 = error
    std::string lasterrmsg;
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        /* Open the metadata index table */
        const std::string metadataIndexFile(m_BP4Deserializer.GetBPMetadataIndexFileName(m_Name));
        flag = OpenWithTimeout(m_MDIndexFileManager, {metadataIndexFile}, timeoutInstant,
                               pollSeconds, lasterrmsg);
        if (flag == 0)
        {
            /* Open the metadata file */
            const std::string metadataFile(m_BP4Deserializer.GetBPMetadataFileName(m_Name));

            /* We found md.idx. If we don't find md.0 immediately  we should
             * wait a little bit hoping for the file system to catch up.
             * This slows down finding the error in file reading mode but
             * it will be more robust in streaming mode
             */
            if (timeoutSeconds == Seconds(0.0))
            {
                timeoutInstant += Seconds(5.0);
            }

            flag = OpenWithTimeout(m_MDFileManager, {metadataFile}, timeoutInstant, pollSeconds,
                                   lasterrmsg);
            if (flag != 0)
            {
                /* Close the metadata index table */
                m_MDIndexFileManager.CloseFiles();
            }
        }
    }
    m_Comm.Barrier("wait for rank 0 to open...");
    flag = m_Comm.BroadcastValue(flag, 0);
    if (flag == 2)
    {
        if (m_BP4Deserializer.m_RankMPI == 0 && !lasterrmsg.empty())
        {
            helper::Throw<std::ios_base::failure>("Engine", "BP4Reader", "OpenFiles",
                                                  "File " + m_Name +
                                                      " cannot be opened: " + lasterrmsg);
        }
        else
        {
            helper::Throw<std::ios_base::failure>("Engine", "BP4Reader", "OpenFiles",
                                                  "File " + m_Name + " cannot be opened");
        }
    }
    else if (flag == 1)
    {
        if (m_BP4Deserializer.m_RankMPI == 0)
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP4Reader", "OpenFiles",
                "File " + m_Name + " could not be found within the " +
                    std::to_string(timeoutSeconds.count()) + "s timeout: " + lasterrmsg);
        }
        else
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP4Reader", "OpenFiles",
                "File " + m_Name + " could not be found within the " +
                    std::to_string(timeoutSeconds.count()) + "s timeout");
        }
    }

    /* At this point we may have an empty index table.
     * The writer has created the file but no content may have been stored yet.
     */
}